

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void av1_lowbd_inv_txfm2d_add_avx2
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob)

{
  code *pcVar1;
  transform_1d_ssse3 p_Var2;
  char *pcVar3;
  byte *pbVar4;
  code *pcVar5;
  int8_t *piVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  undefined1 (*pauVar14) [32];
  long lVar15;
  int iVar16;
  undefined7 in_register_00000009;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  undefined8 extraout_RDX;
  undefined8 uVar20;
  undefined8 extraout_RDX_00;
  undefined1 (*pauVar21) [16];
  ulong extraout_RDX_01;
  uint uVar22;
  int stride_00;
  __m256i *palVar23;
  uint8_t *puVar24;
  int32_t *piVar25;
  int iVar26;
  byte bVar27;
  undefined1 (*pauVar28) [32];
  ulong uVar29;
  undefined7 in_register_00000081;
  uint uVar30;
  __m256i *palVar31;
  undefined1 *puVar32;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  ulong uVar36;
  __m256i *palVar37;
  uint uVar38;
  bool bVar39;
  bool bVar40;
  undefined2 uVar41;
  __m128i alVar42;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  __m256i buf0 [64];
  __m128i buf1 [8];
  int in_stack_ffffffffffff74c0;
  __m256i *local_8b18;
  uint8_t *local_8b10;
  int32_t *local_8b08;
  undefined1 local_8ac0 [32];
  undefined1 local_8a60 [32];
  undefined1 local_8a40 [32];
  undefined1 local_8a20 [32];
  undefined1 local_8a00 [1952];
  longlong local_8260 [64];
  undefined1 local_8060 [32];
  undefined1 local_8040 [32];
  undefined1 local_8020 [32];
  undefined1 local_8000 [1022] [32];
  undefined1 auVar56 [32];
  undefined1 auVar60 [32];
  undefined1 auVar63 [32];
  undefined1 auVar66 [32];
  
  piVar6 = av1_inv_txfm_shift_ls[1];
  uVar19 = (ulong)(uint)eob;
  uVar36 = (ulong)tx_type;
  uVar38 = (uint)CONCAT71(in_register_00000081,tx_size);
  if (uVar38 < 0x11) {
    if ((0x1e1e1U >> (uVar38 & 0x1f) & 1) == 0) {
      if (uVar38 == 1) {
        if (tx_type < 0x10) {
          uVar38 = (uint)tx_type;
          if ((0x5400U >> (uVar38 & 0x1f) & 1) != 0) {
            av1_lowbd_inv_txfm2d_add_h_identity_ssse3(input,output,stride,tx_type,'\x01',eob);
            return;
          }
          if ((0xa800U >> (uVar38 & 0x1f) & 1) != 0) {
            av1_lowbd_inv_txfm2d_add_v_identity_ssse3(input,output,stride,tx_type,'\x01',eob);
            return;
          }
          if (uVar38 == 9) {
            av1_lowbd_inv_txfm2d_add_idtx_ssse3(input,output,stride,'\x01');
            return;
          }
        }
        bVar39 = 8 < tx_type;
        uVar38 = 0xaf >> (tx_type & 0x1f);
        p_Var2 = lowbd_txfm_all_1d_zeros_8x8_arr[""[uVar36]][eob != 1];
        auVar49 = vpackssdw_avx2(*(undefined1 (*) [32])input,*(undefined1 (*) [32])(input + 8));
        auVar51 = vpackssdw_avx2(*(undefined1 (*) [32])(input + 0x10),
                                 *(undefined1 (*) [32])(input + 0x18));
        auVar54 = vpackssdw_avx2(*(undefined1 (*) [32])(input + 0x20),
                                 *(undefined1 (*) [32])(input + 0x28));
        auVar45 = vpackssdw_avx2(*(undefined1 (*) [32])(input + 0x30),
                                 *(undefined1 (*) [32])(input + 0x38));
        local_8a60 = vpermq_avx2(auVar49,0xd8);
        local_8a40 = vpermq_avx2(auVar51,0xd8);
        local_8a20 = vpermq_avx2(auVar54,0xd8);
        local_8a00._0_32_ = vpermq_avx2(auVar45,0xd8);
        (*lowbd_txfm_all_1d_zeros_8x8_arr[""[uVar36]][eob != 1])
                  ((__m128i *)local_8a60,(__m128i *)local_8a60);
        if ((0x11fU >> (tx_type & 0x1f) & 1) == 0 && !bVar39) {
          auVar49._0_16_ = ZEXT116(0) * local_8a40._16_16_ + ZEXT116(1) * local_8a00._16_16_;
          auVar49._16_16_ = ZEXT116(1) * local_8a40._16_16_;
          auVar51._0_16_ = ZEXT116(0) * local_8a40._0_16_ + ZEXT116(1) * local_8a00._0_16_;
          auVar51._16_16_ = ZEXT116(1) * local_8a40._0_16_;
          auVar54._0_16_ = ZEXT116(0) * local_8a60._16_16_ + ZEXT116(1) * local_8a20._16_16_;
          auVar54._16_16_ = ZEXT116(1) * local_8a60._16_16_;
          alVar42 = (__m128i)local_8a60._0_16_;
          auVar53 = local_8a20._0_16_;
        }
        else {
          auVar49._0_16_ = ZEXT116(0) * local_8a20._0_16_ + ZEXT116(1) * local_8a60._0_16_;
          auVar49._16_16_ = ZEXT116(1) * local_8a20._0_16_;
          auVar51._0_16_ = ZEXT116(0) * local_8a20._16_16_ + ZEXT116(1) * local_8a60._16_16_;
          auVar51._16_16_ = ZEXT116(1) * local_8a20._16_16_;
          auVar54._0_16_ = ZEXT116(0) * local_8a00._0_16_ + ZEXT116(1) * local_8a40._0_16_;
          auVar54._16_16_ = ZEXT116(1) * local_8a00._0_16_;
          alVar42 = (__m128i)local_8a00._16_16_;
          auVar53 = local_8a40._16_16_;
        }
        auVar59._0_2_ = (undefined2)(1 << (*piVar6 + 0xfU & 0x1f));
        auVar59._2_2_ = auVar59._0_2_;
        auVar59._4_2_ = auVar59._0_2_;
        auVar59._6_2_ = auVar59._0_2_;
        auVar59._8_2_ = auVar59._0_2_;
        auVar59._10_2_ = auVar59._0_2_;
        auVar59._12_2_ = auVar59._0_2_;
        auVar59._14_2_ = auVar59._0_2_;
        auVar59._16_2_ = auVar59._0_2_;
        auVar59._18_2_ = auVar59._0_2_;
        auVar59._20_2_ = auVar59._0_2_;
        auVar59._22_2_ = auVar59._0_2_;
        auVar59._24_2_ = auVar59._0_2_;
        auVar59._26_2_ = auVar59._0_2_;
        auVar59._28_2_ = auVar59._0_2_;
        auVar59._30_2_ = auVar59._0_2_;
        auVar45._0_16_ = ZEXT116(0) * (undefined1  [16])alVar42 + ZEXT116(1) * auVar53;
        auVar45._16_16_ = ZEXT116(1) * (undefined1  [16])alVar42;
        auVar49 = vpmulhrsw_avx2(auVar49,auVar59);
        auVar51 = vpmulhrsw_avx2(auVar51,auVar59);
        auVar54 = vpmulhrsw_avx2(auVar54,auVar59);
        auVar45 = vpmulhrsw_avx2(auVar45,auVar59);
        auVar59 = vpunpcklwd_avx2(auVar49,auVar51);
        auVar49 = vpunpckhwd_avx2(auVar49,auVar51);
        auVar46 = vpunpcklwd_avx2(auVar54,auVar45);
        auVar51 = vpunpckhwd_avx2(auVar54,auVar45);
        auVar54 = vpunpckldq_avx2(auVar59,auVar46);
        local_8060 = vpermq_avx2(auVar54,0xd8);
        auVar54 = vpunpckhdq_avx2(auVar59,auVar46);
        local_8040 = vpermq_avx2(auVar54,0xd8);
        auVar54 = vpunpckldq_avx2(auVar49,auVar51);
        local_8020 = vpermq_avx2(auVar54,0xd8);
        auVar49 = vpunpckhdq_avx2(auVar49,auVar51);
        local_8000[0] = vpermq_avx2(auVar49,0xd8);
        (*p_Var2)((__m128i *)local_8060,(__m128i *)local_8060);
        uVar12 = ((byte)((byte)uVar38 | bVar39) & 1) - 1 | 1;
        iVar26 = 7;
        pauVar14 = local_8000;
        if ((uVar38 & 1) != 0 || bVar39) {
          iVar26 = 0;
          pauVar14 = (undefined1 (*) [32])(local_8060 + 0x10);
        }
        iVar16 = iVar26 + uVar12 * 2;
        auVar48._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])*pauVar14 +
             ZEXT116(1) * *(undefined1 (*) [16])(local_8060 + (uint)(iVar26 << 4));
        auVar48._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])*pauVar14;
        iVar26 = iVar16 + uVar12 * 2;
        auVar50._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(local_8060 + (long)(int)(iVar16 + uVar12) * 0x10) +
             ZEXT116(1) * *(undefined1 (*) [16])(local_8060 + (long)iVar16 * 0x10);
        auVar50._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(local_8060 + (long)(int)(iVar16 + uVar12) * 0x10);
        iVar16 = iVar26 + uVar12 * 2;
        auVar52._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(local_8060 + (long)(int)(iVar26 + uVar12) * 0x10) +
             ZEXT116(1) * *(undefined1 (*) [16])(local_8060 + (long)iVar26 * 0x10);
        auVar52._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(local_8060 + (long)(int)(iVar26 + uVar12) * 0x10);
        auVar46._0_2_ = (undefined2)(1 << (piVar6[1] + 0xfU & 0x1f));
        auVar46._2_2_ = auVar46._0_2_;
        auVar46._4_2_ = auVar46._0_2_;
        auVar46._6_2_ = auVar46._0_2_;
        auVar46._8_2_ = auVar46._0_2_;
        auVar46._10_2_ = auVar46._0_2_;
        auVar46._12_2_ = auVar46._0_2_;
        auVar46._14_2_ = auVar46._0_2_;
        auVar46._16_2_ = auVar46._0_2_;
        auVar46._18_2_ = auVar46._0_2_;
        auVar46._20_2_ = auVar46._0_2_;
        auVar46._22_2_ = auVar46._0_2_;
        auVar46._24_2_ = auVar46._0_2_;
        auVar46._26_2_ = auVar46._0_2_;
        auVar46._28_2_ = auVar46._0_2_;
        auVar46._30_2_ = auVar46._0_2_;
        auVar55._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(local_8060 + (long)(int)(iVar16 + uVar12) * 0x10) +
             ZEXT116(1) * *(undefined1 (*) [16])(local_8060 + (long)iVar16 * 0x10);
        auVar55._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(local_8060 + (long)(int)(iVar16 + uVar12) * 0x10);
        auVar49 = vpmulhrsw_avx2(auVar48,auVar46);
        auVar51 = vpmulhrsw_avx2(auVar50,auVar46);
        auVar54 = vpmulhrsw_avx2(auVar52,auVar46);
        auVar45 = vpmulhrsw_avx2(auVar55,auVar46);
        lVar15 = (long)stride;
        auVar53._8_8_ = 0;
        auVar53._0_8_ = *(ulong *)(output + lVar15);
        auVar57._8_8_ = 0;
        auVar57._0_8_ = *(ulong *)output;
        auVar56._0_16_ = ZEXT116(0) * auVar53 + ZEXT116(1) * auVar57;
        auVar56._16_16_ = ZEXT116(1) * auVar53;
        auVar58._8_8_ = 0;
        auVar58._0_8_ = *(ulong *)(output + lVar15 * 3);
        auVar61._8_8_ = 0;
        auVar61._0_8_ = *(ulong *)(output + lVar15 * 2);
        auVar60._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar61;
        auVar60._16_16_ = ZEXT116(1) * auVar58;
        auVar62._8_8_ = 0;
        auVar62._0_8_ = *(ulong *)(output + lVar15 * 5);
        auVar64._8_8_ = 0;
        auVar64._0_8_ = *(ulong *)(output + lVar15 * 4);
        auVar63._0_16_ = ZEXT116(0) * auVar62 + ZEXT116(1) * auVar64;
        auVar63._16_16_ = ZEXT116(1) * auVar62;
        auVar65._8_8_ = 0;
        auVar65._0_8_ = *(ulong *)(output + lVar15 * 7);
        auVar67._8_8_ = 0;
        auVar67._0_8_ = *(ulong *)(output + lVar15 * 6);
        auVar66._0_16_ = ZEXT116(0) * auVar65 + ZEXT116(1) * auVar67;
        auVar66._16_16_ = ZEXT116(1) * auVar65;
        auVar59 = vpunpcklbw_avx2(auVar56,ZEXT1632((undefined1  [16])0x0));
        auVar49 = vpaddsw_avx2(auVar49,auVar59);
        auVar59 = vpunpcklbw_avx2(auVar60,ZEXT1632((undefined1  [16])0x0));
        auVar51 = vpaddsw_avx2(auVar51,auVar59);
        auVar49 = vpackuswb_avx2(auVar49,auVar51);
        auVar51 = vpunpcklbw_avx2(auVar63,ZEXT1632((undefined1  [16])0x0));
        auVar51 = vpaddsw_avx2(auVar54,auVar51);
        auVar54 = vpunpcklbw_avx2(auVar66,ZEXT1632((undefined1  [16])0x0));
        auVar54 = vpaddsw_avx2(auVar45,auVar54);
        *(long *)output = auVar49._0_8_;
        *(long *)(output + lVar15) = auVar49._16_8_;
        uVar20 = vpextrq_avx(auVar49._0_16_,1);
        *(undefined8 *)(output + lVar15 * 2) = uVar20;
        uVar20 = vpextrq_avx(auVar49._16_16_,1);
        *(undefined8 *)(output + lVar15 * 3) = uVar20;
        auVar49 = vpackuswb_avx2(auVar51,auVar54);
        *(long *)(output + lVar15 * 4) = auVar49._0_8_;
        *(long *)(output + lVar15 * 5) = auVar49._16_8_;
        uVar20 = vpextrq_avx(auVar49._0_16_,1);
        *(undefined8 *)(output + lVar15 * 6) = uVar20;
        uVar20 = vpextrq_avx(auVar49._16_16_,1);
        *(undefined8 *)(output + lVar15 * 7) = uVar20;
        return;
      }
      goto code_r0x0039a57c;
    }
switchD_0039a58f_default:
    av1_lowbd_inv_txfm2d_add_ssse3(input,output,stride,tx_type,tx_size,eob);
  }
  else {
code_r0x0039a57c:
    local_8b10 = output;
    switch(uVar36) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
      uVar38 = 0;
      iVar26 = 0;
      if (eob != 1) {
        uVar38 = (int)av1_eob_to_eobxy_default[tx_size]
                      [eob + -1 >> (*(byte *)(tx_size_wide_log2_eob + tx_size) & 0x1f)] & 0xff;
        iVar26 = (int)av1_eob_to_eobxy_default[tx_size]
                      [eob + -1 >> (*(byte *)(tx_size_wide_log2_eob + tx_size) & 0x1f)] >> 8;
      }
      pcVar3 = av1_inv_txfm_shift_ls[tx_size];
      iVar16 = tx_size_wide_log2[tx_size];
      iVar11 = tx_size_high_log2[tx_size];
      uVar12 = tx_size_wide[tx_size];
      uVar10 = tx_size_high[tx_size];
      uVar7 = (int)uVar12 >> 4;
      iVar8 = (uVar38 & 0xfffffff0) + 0x10;
      uVar22 = iVar26 + 0x10 >> 4;
      uVar35 = 0x20;
      if ((int)uVar10 < 0x20) {
        uVar35 = uVar10;
      }
      iVar9 = get_rect_tx_log_ratio(uVar12,uVar10);
      bVar39 = 8 < tx_type;
      uVar30 = 0xaf >> (tx_type & 0x1f);
      pcVar5 = *(code **)((ulong)""[uVar36] * 0x20 + (long)iVar16 * 0x60 + 0x54f180 +
                         (long)lowbd_txfm_all_1d_zeros_idx[uVar38] * 8);
      pcVar1 = *(code **)((ulong)""[uVar36] * 0x20 + (long)iVar11 * 0x60 + 0x54f180 +
                         (long)lowbd_txfm_all_1d_zeros_idx[iVar26] * 8);
      local_8ac0._2_2_ = (undefined2)(1 << (*pcVar3 + 0xfU & 0x1f));
      local_8ac0._0_2_ = local_8ac0._2_2_;
      local_8ac0._4_2_ = local_8ac0._2_2_;
      local_8ac0._6_2_ = local_8ac0._2_2_;
      local_8ac0._8_2_ = local_8ac0._2_2_;
      local_8ac0._10_2_ = local_8ac0._2_2_;
      local_8ac0._12_2_ = local_8ac0._2_2_;
      local_8ac0._14_2_ = local_8ac0._2_2_;
      local_8ac0._16_2_ = local_8ac0._2_2_;
      local_8ac0._18_2_ = local_8ac0._2_2_;
      local_8ac0._20_2_ = local_8ac0._2_2_;
      local_8ac0._22_2_ = local_8ac0._2_2_;
      local_8ac0._24_2_ = local_8ac0._2_2_;
      local_8ac0._26_2_ = local_8ac0._2_2_;
      local_8ac0._28_2_ = local_8ac0._2_2_;
      local_8ac0._30_2_ = local_8ac0._2_2_;
      uVar36 = 0;
      if ((int)uVar12 < 1) {
        uVar12 = 0;
      }
      lVar15 = (long)(int)uVar10;
      uVar19 = 0;
      if (0 < (int)uVar7) {
        uVar19 = (ulong)uVar7;
      }
      if ((int)uVar22 < 1) {
        uVar22 = 0;
      }
      palVar23 = (__m256i *)(local_8060 + ((long)(int)uVar7 + -1) * lVar15 * 0x20);
      local_8b18 = (__m256i *)local_8060;
      for (; uVar36 != uVar22; uVar36 = uVar36 + 1) {
        load_buffer_32bit_to_16bit_w16_avx2
                  (input + uVar36 * 0x10,uVar35,(__m256i *)local_8a60,iVar8);
        if ((iVar9 == 1) || (iVar9 == -1)) {
          round_shift_avx2((__m256i *)local_8a60,(__m256i *)local_8a60,iVar8);
        }
        (*pcVar5)((__m256i *)local_8a60,(__m256i *)local_8a60);
        for (lVar13 = 0; (ulong)uVar12 * 0x20 != lVar13; lVar13 = lVar13 + 0x20) {
          auVar49 = vpmulhrsw_avx2(local_8ac0,*(undefined1 (*) [32])(local_8a60 + lVar13));
          *(undefined1 (*) [32])(local_8a60 + lVar13) = auVar49;
        }
        if ((0x11fU >> (tx_type & 0x1f) & 1) == 0 && !bVar39) {
          palVar37 = (__m256i *)local_8a60;
          uVar20 = extraout_RDX;
          uVar29 = uVar19;
          palVar31 = palVar23;
          while (bVar40 = uVar29 != 0, uVar29 = uVar29 - 1, bVar40) {
            flip_buf_avx2(palVar37,(__m256i *)local_8260,(int)uVar20);
            transpose_16bit_16x16_avx2((__m256i *)local_8260,palVar31);
            palVar31 = palVar31 + -lVar15;
            palVar37 = palVar37 + 0x10;
            uVar20 = extraout_RDX_00;
          }
        }
        else {
          palVar37 = (__m256i *)local_8a60;
          uVar29 = uVar19;
          palVar31 = local_8b18;
          while (bVar40 = uVar29 != 0, uVar29 = uVar29 - 1, bVar40) {
            transpose_16bit_16x16_avx2(palVar37,palVar31);
            palVar31 = palVar31 + lVar15;
            palVar37 = palVar37 + 0x10;
          }
        }
        palVar23 = palVar23 + 0x10;
        local_8b18 = local_8b18 + 0x10;
      }
      uVar29 = 0;
      uVar36 = 0;
      if (0 < (int)uVar10) {
        uVar36 = (ulong)uVar10;
      }
      uVar41 = (undefined2)(1 << (pcVar3[1] + 0xfU & 0x1f));
      auVar47._2_2_ = uVar41;
      auVar47._0_2_ = uVar41;
      auVar47._4_2_ = uVar41;
      auVar47._6_2_ = uVar41;
      auVar47._8_2_ = uVar41;
      auVar47._10_2_ = uVar41;
      auVar47._12_2_ = uVar41;
      auVar47._14_2_ = uVar41;
      auVar47._16_2_ = uVar41;
      auVar47._18_2_ = uVar41;
      auVar47._20_2_ = uVar41;
      auVar47._22_2_ = uVar41;
      auVar47._24_2_ = uVar41;
      auVar47._26_2_ = uVar41;
      auVar47._28_2_ = uVar41;
      auVar47._30_2_ = uVar41;
      puVar32 = local_8060;
      for (; uVar29 != uVar19; uVar29 = uVar29 + 1) {
        (*pcVar1)(local_8060 + uVar29 * lVar15 * 0x20,local_8060 + uVar29 * lVar15 * 0x20);
        for (lVar13 = 0; uVar36 << 5 != lVar13; lVar13 = lVar13 + 0x20) {
          auVar49 = vpmulhrsw_avx2(auVar47,*(undefined1 (*) [32])(puVar32 + lVar13));
          *(undefined1 (*) [32])(puVar32 + lVar13) = auVar49;
        }
        puVar32 = puVar32 + lVar15 * 0x20;
      }
      uVar18 = 0;
      uVar29 = (long)(int)(uVar10 - 1);
      if ((uVar30 & 1) != 0 || bVar39) {
        uVar29 = uVar18;
      }
      pauVar14 = (undefined1 (*) [32])(local_8060 + uVar29 * 0x20);
      for (; pauVar28 = pauVar14, uVar29 = uVar36, pauVar21 = (undefined1 (*) [16])output,
          uVar18 != uVar19; uVar18 = uVar18 + 1) {
        while (uVar29 != 0) {
          auVar49 = vpmovzxbw_avx2(*pauVar21);
          auVar49 = vpaddsw_avx2(auVar49,*pauVar28);
          auVar53 = vpackuswb_avx(auVar49._0_16_,auVar49._16_16_);
          *pauVar21 = auVar53;
          pauVar28 = (undefined1 (*) [32])
                     (pauVar28[-1] + (((byte)((byte)uVar30 | bVar39) & 1) << 6));
          uVar29 = uVar29 - 1;
          pauVar21 = (undefined1 (*) [16])(*pauVar21 + stride);
        }
        output = (uint8_t *)((long)output + 0x10);
        pauVar14 = pauVar14 + lVar15;
      }
      break;
    case 9:
      pcVar3 = av1_inv_txfm_shift_ls[tx_size];
      iVar26 = tx_size_wide_log2[tx_size];
      iVar16 = tx_size_high_log2[tx_size];
      iVar11 = tx_size_wide[tx_size];
      iVar8 = 0x20;
      if (iVar11 < 0x20) {
        iVar8 = iVar11;
      }
      iVar9 = tx_size_high[tx_size];
      stride_00 = 0x20;
      if (iVar9 < 0x20) {
        stride_00 = iVar9;
      }
      iVar11 = get_rect_tx_log_ratio(iVar11,iVar9);
      uVar19 = 0;
      uVar36 = (ulong)(uint)(stride_00 >> 4);
      if (stride_00 >> 4 < 1) {
        uVar36 = uVar19;
      }
      uVar29 = (ulong)(uint)(iVar8 >> 4);
      if (iVar8 >> 4 < 1) {
        uVar29 = uVar19;
      }
      local_8b08 = input;
      for (; piVar25 = local_8b08, uVar18 = uVar36, puVar24 = local_8b10, uVar19 != uVar29;
          uVar19 = uVar19 + 1) {
        while (uVar18 != 0) {
          iVar8 = iVar11;
          iidentity_row_16xn_avx2
                    ((__m256i *)local_8060,piVar25,stride_00,(int)*pcVar3,iVar26 + -2,iVar11,
                     in_stack_ffffffffffff74c0);
          transpose_16bit_16x16_avx2((__m256i *)local_8060,(__m256i *)local_8060);
          iidentity_col_16xn_avx2
                    (puVar24,stride,(__m256i *)local_8060,(int)pcVar3[1],iVar16 + -2,iVar8);
          piVar25 = piVar25 + 0x10;
          uVar18 = uVar18 - 1;
          puVar24 = puVar24 + (long)stride * 0x10;
        }
        local_8b10 = local_8b10 + 0x10;
        local_8b08 = local_8b08 + (long)stride_00 * 0x10;
      }
      break;
    case 10:
    case 0xc:
    case 0xe:
      uVar38 = tx_size_wide[tx_size];
      uVar12 = 0x20;
      if ((int)uVar38 < 0x20) {
        uVar12 = uVar38;
      }
      if (eob < (int)uVar12) {
        iVar26 = eob_fill[eob + -1];
      }
      else {
        iVar26 = uVar12 - 1;
      }
      iVar16 = eob_fill[(eob + -1) / (int)uVar12];
      pcVar3 = av1_inv_txfm_shift_ls[tx_size];
      iVar11 = tx_size_wide_log2[tx_size];
      iVar8 = tx_size_high_log2[tx_size];
      uVar12 = tx_size_high[tx_size];
      uVar10 = 0x20;
      if ((int)uVar12 < 0x20) {
        uVar10 = uVar12;
      }
      uVar22 = iVar26 + 0x10 >> 4;
      uVar35 = iVar16 + 0x10 >> 4;
      iVar26 = get_rect_tx_log_ratio(uVar38,uVar12);
      bVar27 = (byte)(tx_type - 4) >> 1;
      bVar39 = 5 < (byte)(bVar27 | tx_type << 7);
      bVar27 = 0x18 >> (bVar27 & 0x1f);
      pcVar5 = *(code **)((ulong)""[uVar36] * 0x20 + (long)iVar8 * 0x60 + 0x54f180 +
                         (long)lowbd_txfm_all_1d_zeros_idx[iVar16] * 8);
      uVar19 = 0;
      uVar36 = (ulong)uVar35;
      if ((int)uVar35 < 1) {
        uVar36 = uVar19;
      }
      uVar29 = (long)(int)uVar12 - 1;
      if ((bVar27 & 1) != 0 || bVar39) {
        uVar29 = uVar19;
      }
      uVar18 = 0;
      if (0 < (int)uVar12) {
        uVar18 = (ulong)uVar12;
      }
      uVar17 = (ulong)uVar22;
      if ((int)uVar22 < 1) {
        uVar17 = uVar19;
      }
      for (uVar34 = 0; uVar34 != uVar17; uVar34 = uVar34 + 1) {
        piVar25 = input + (int)uVar19;
        for (lVar15 = 0; uVar36 * 0x200 != lVar15; lVar15 = lVar15 + 0x200) {
          palVar23 = (__m256i *)(local_8060 + lVar15);
          iidentity_row_16xn_avx2
                    (palVar23,piVar25,uVar10,(int)*pcVar3,iVar11 + -2,iVar26,
                     in_stack_ffffffffffff74c0);
          transpose_16bit_16x16_avx2(palVar23,palVar23);
          piVar25 = piVar25 + 0x10;
        }
        (*pcVar5)(local_8060,local_8060);
        auVar43._0_2_ = (undefined2)(1 << (pcVar3[1] + 0xfU & 0x1f));
        auVar43._2_2_ = auVar43._0_2_;
        auVar43._4_2_ = auVar43._0_2_;
        auVar43._6_2_ = auVar43._0_2_;
        auVar43._8_2_ = auVar43._0_2_;
        auVar43._10_2_ = auVar43._0_2_;
        auVar43._12_2_ = auVar43._0_2_;
        auVar43._14_2_ = auVar43._0_2_;
        auVar43._16_2_ = auVar43._0_2_;
        auVar43._18_2_ = auVar43._0_2_;
        auVar43._20_2_ = auVar43._0_2_;
        auVar43._22_2_ = auVar43._0_2_;
        auVar43._24_2_ = auVar43._0_2_;
        auVar43._26_2_ = auVar43._0_2_;
        auVar43._28_2_ = auVar43._0_2_;
        auVar43._30_2_ = auVar43._0_2_;
        pauVar14 = (undefined1 (*) [32])(local_8060 + uVar29 * 0x20);
        uVar33 = uVar18;
        pauVar21 = (undefined1 (*) [16])output;
        while (bVar40 = uVar33 != 0, uVar33 = uVar33 - 1, bVar40) {
          auVar51 = vpmulhrsw_avx2(auVar43,*pauVar14);
          auVar49 = vpmovzxbw_avx2(*pauVar21);
          auVar49 = vpaddsw_avx2(auVar49,auVar51);
          auVar53 = vpackuswb_avx(auVar49._0_16_,auVar49._16_16_);
          *pauVar21 = auVar53;
          pauVar21 = (undefined1 (*) [16])(*pauVar21 + stride);
          pauVar14 = (undefined1 (*) [32])(pauVar14[-1] + (((bVar27 | bVar39) & 1) << 6));
        }
        uVar19 = (ulong)((int)uVar19 + uVar10 * 0x10);
        output = (uint8_t *)((long)output + 0x10);
      }
      break;
    case 0xb:
    case 0xd:
    case 0xf:
      iVar26 = tx_size_high[tx_size];
      iVar16 = 0x20;
      if (iVar26 < 0x20) {
        iVar16 = iVar26;
      }
      uVar38 = eob_fill[(eob + -1) / iVar16];
      if (eob < iVar16) {
        iVar11 = eob_fill[eob + -1];
      }
      else {
        iVar11 = iVar16 + -1;
      }
      pbVar4 = (byte *)av1_inv_txfm_shift_ls[tx_size];
      iVar8 = tx_size_wide_log2[tx_size];
      iVar9 = tx_size_high_log2[tx_size];
      uVar12 = tx_size_wide[tx_size];
      uVar10 = (int)uVar12 >> 4;
      uVar22 = iVar11 + 0x10 >> 4;
      iVar11 = (uVar38 & 0xfffffff8) + 8;
      iVar26 = get_rect_tx_log_ratio(uVar12,iVar26);
      pcVar5 = *(code **)((ulong)""[uVar36] * 0x20 + (long)iVar8 * 0x60 + 0x54f180 +
                         (long)lowbd_txfm_all_1d_zeros_idx[(int)uVar38] * 8);
      uVar29 = 0;
      uVar36 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar36 = uVar29;
      }
      uVar18 = 0;
      if (0 < (int)uVar10) {
        uVar18 = (ulong)uVar10;
      }
      uVar17 = (ulong)uVar22;
      if ((int)uVar22 < 1) {
        uVar17 = uVar29;
      }
      for (; uVar29 != uVar17; uVar29 = uVar29 + 1) {
        load_buffer_32bit_to_16bit_w16_avx2
                  (input + uVar29 * 0x10,iVar16,(__m256i *)local_8a60,iVar11);
        if ((iVar26 == 1) || (iVar26 == -1)) {
          round_shift_avx2((__m256i *)local_8a60,(__m256i *)local_8a60,iVar11);
        }
        (*pcVar5)((__m256i *)local_8a60,(__m256i *)local_8a60);
        bVar27 = *pbVar4;
        if ((char)bVar27 < '\0') {
          auVar44._0_2_ = (undefined2)(1 << (~bVar27 & 0x1f));
          auVar44._2_2_ = auVar44._0_2_;
          auVar44._4_2_ = auVar44._0_2_;
          auVar44._6_2_ = auVar44._0_2_;
          auVar44._8_2_ = auVar44._0_2_;
          auVar44._10_2_ = auVar44._0_2_;
          auVar44._12_2_ = auVar44._0_2_;
          auVar44._14_2_ = auVar44._0_2_;
          auVar44._16_2_ = auVar44._0_2_;
          auVar44._18_2_ = auVar44._0_2_;
          auVar44._20_2_ = auVar44._0_2_;
          auVar44._22_2_ = auVar44._0_2_;
          auVar44._24_2_ = auVar44._0_2_;
          auVar44._26_2_ = auVar44._0_2_;
          auVar44._28_2_ = auVar44._0_2_;
          auVar44._30_2_ = auVar44._0_2_;
          for (lVar15 = 0; uVar36 << 5 != lVar15; lVar15 = lVar15 + 0x20) {
            auVar49 = vpaddsw_avx2(auVar44,*(undefined1 (*) [32])(local_8a60 + lVar15));
            auVar49 = vpsraw_avx2(auVar49,ZEXT416((uint)-(int)(char)bVar27));
            *(undefined1 (*) [32])(local_8a60 + lVar15) = auVar49;
          }
        }
        else if (bVar27 != 0) {
          for (lVar15 = 0; uVar36 << 5 != lVar15; lVar15 = lVar15 + 0x20) {
            auVar49 = vpsllw_avx2(*(undefined1 (*) [32])(local_8a60 + lVar15),
                                  ZEXT416((uint)(int)(char)bVar27));
            *(undefined1 (*) [32])(local_8a60 + lVar15) = auVar49;
          }
        }
        uVar34 = CONCAT71(in_register_00000009,tx_type) & 0xffffffff;
        if ((char)uVar34 == '\x0f') {
          palVar23 = (__m256i *)local_8a60;
          uVar33 = uVar18;
          palVar37 = (__m256i *)(local_8260 + (long)(int)uVar10 * 0x40);
          while (bVar39 = uVar33 != 0, uVar33 = uVar33 - 1, bVar39) {
            flip_buf_avx2(palVar23,(__m256i *)local_8260,(int)uVar34);
            transpose_16bit_16x16_avx2((__m256i *)local_8260,palVar37);
            palVar37 = palVar37 + -0x10;
            palVar23 = palVar23 + 0x10;
            uVar34 = extraout_RDX_01;
          }
        }
        else {
          palVar23 = (__m256i *)local_8a60;
          palVar37 = (__m256i *)local_8060;
          uVar34 = uVar18;
          while (bVar39 = uVar34 != 0, uVar34 = uVar34 - 1, bVar39) {
            transpose_16bit_16x16_avx2(palVar23,palVar37);
            palVar37 = palVar37 + 0x10;
            palVar23 = palVar23 + 0x10;
          }
        }
        palVar23 = (__m256i *)local_8060;
        puVar24 = local_8b10;
        uVar34 = uVar18;
        while (bVar39 = uVar34 != 0, uVar34 = uVar34 - 1, bVar39) {
          iidentity_col_16xn_avx2
                    (puVar24,stride,palVar23,(int)(char)pbVar4[1],iVar9 + -2,(int)uVar19);
          palVar23 = palVar23 + 0x10;
          puVar24 = puVar24 + 0x10;
        }
        local_8b10 = local_8b10 + (long)stride * 0x10;
      }
      break;
    default:
      goto switchD_0039a58f_default;
    }
  }
  return;
}

Assistant:

void av1_lowbd_inv_txfm2d_add_avx2(const int32_t *input, uint8_t *output,
                                   int stride, TX_TYPE tx_type, TX_SIZE tx_size,
                                   int eob) {
  switch (tx_size) {
    case TX_4X4:
    case TX_4X8:
    case TX_8X4:
    case TX_8X16:
    case TX_16X8:
    case TX_4X16:
    case TX_16X4:
    case TX_8X32:
    case TX_32X8:
      av1_lowbd_inv_txfm2d_add_ssse3(input, output, stride, tx_type, tx_size,
                                     eob);
      break;
    case TX_8X8:
      lowbd_inv_txfm2d_add_8x8_avx2(input, output, stride, tx_type, tx_size,
                                    eob);
      break;
    case TX_16X16:
    case TX_32X32:
    case TX_64X64:
    case TX_16X32:
    case TX_32X16:
    case TX_32X64:
    case TX_64X32:
    case TX_16X64:
    case TX_64X16:
    default:
      lowbd_inv_txfm2d_add_universe_avx2(input, output, stride, tx_type,
                                         tx_size, eob);
      break;
  }
}